

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCallback.cc
# Opt level: O3

void __thiscall
flow::NativeCallback::NativeCallback(NativeCallback *this,Runtime *runtime,string *_name)

{
  this->runtime_ = runtime;
  this->isHandler_ = true;
  *(undefined8 *)&(this->verifier_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->verifier_).super__Function_base._M_functor + 8) = 0;
  (this->verifier_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->verifier_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->function_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->function_).super__Function_base._M_functor + 8) = 0;
  (this->function_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->function_)._M_invoker = (_Invoker_type)0x0;
  Signature::Signature(&this->signature_);
  this->attributes_ = 0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->defaults_).
  super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defaults_).
  super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->defaults_).
  super__Vector_base<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->signature_);
  (this->signature_).returnType_ = Boolean;
  return;
}

Assistant:

NativeCallback::NativeCallback(Runtime* runtime, const std::string& _name)
    : runtime_(runtime),
      isHandler_(true),
      verifier_(),
      function_(),
      signature_(),
      attributes_(0) {
  signature_.setName(_name);
  signature_.setReturnType(LiteralType::Boolean);
}